

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtoa.h
# Opt level: O0

void rapidjson::internal::DigitGen(DiyFp *W,DiyFp *Mp,uint64_t delta,char *buffer,int *len,int *K)

{
  int iVar1;
  char cVar2;
  ulong rest;
  char *in_RCX;
  ulong in_RDX;
  ulong *in_RSI;
  int *in_R8;
  int *in_R9;
  DiyFp DVar3;
  int index;
  char d_1;
  uint64_t tmp;
  uint32_t d;
  int kappa;
  uint64_t p2;
  uint32_t p1;
  DiyFp wp_w;
  DiyFp one;
  DiyFp *in_stack_ffffffffffffff28;
  DiyFp *in_stack_ffffffffffffff30;
  uint64_t uVar4;
  uint local_78;
  int local_74;
  ulong local_70;
  uint local_64;
  DiyFp local_40;
  int *local_30;
  int *local_28;
  char *local_20;
  ulong local_18;
  ulong *local_10;
  
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  DiyFp::DiyFp(&local_40,1L << (-(char)(int)in_RSI[1] & 0x3fU),(int)in_RSI[1]);
  DVar3 = DiyFp::operator-(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  local_64 = (uint)(*local_10 >> (-(char)local_40.e & 0x3fU));
  local_70 = *local_10 & local_40.f - 1;
  local_74 = CountDecimalDigit32(local_64);
  *local_28 = 0;
  do {
    if (local_74 < 1) {
      do {
        local_18 = local_18 * 10;
        cVar2 = (char)(local_70 * 10 >> (-(char)local_40.e & 0x3fU));
        if ((cVar2 != '\0') || (*local_28 != 0)) {
          iVar1 = *local_28;
          *local_28 = iVar1 + 1;
          local_20[iVar1] = cVar2 + '0';
        }
        local_70 = local_40.f - 1 & local_70 * 10;
        local_74 = local_74 + -1;
      } while (local_18 <= local_70);
      *local_30 = local_74 + *local_30;
      if (-local_74 < 0x14) {
        uVar4 = DigitGen::kPow10[-local_74];
      }
      else {
        uVar4 = 0;
      }
      GrisuRound(local_20,*local_28,local_18,local_70,local_40.f,DVar3.f * uVar4);
      return;
    }
    local_78 = 0;
    switch(local_74) {
    case 1:
      local_78 = local_64;
      local_64 = 0;
      break;
    case 2:
      local_78 = local_64 / 10;
      local_64 = local_64 % 10;
      break;
    case 3:
      local_78 = local_64 / 100;
      local_64 = local_64 % 100;
      break;
    case 4:
      local_78 = local_64 / 1000;
      local_64 = local_64 % 1000;
      break;
    case 5:
      local_78 = local_64 / 10000;
      local_64 = local_64 % 10000;
      break;
    case 6:
      local_78 = local_64 / 100000;
      local_64 = local_64 % 100000;
      break;
    case 7:
      local_78 = local_64 / 1000000;
      local_64 = local_64 % 1000000;
      break;
    case 8:
      local_78 = local_64 / 10000000;
      local_64 = local_64 % 10000000;
      break;
    case 9:
      local_78 = local_64 / 100000000;
      local_64 = local_64 % 100000000;
    }
    if ((local_78 != 0) || (*local_28 != 0)) {
      iVar1 = *local_28;
      *local_28 = iVar1 + 1;
      local_20[iVar1] = (char)local_78 + '0';
    }
    local_74 = local_74 + -1;
    rest = ((ulong)local_64 << (-(char)local_40.e & 0x3fU)) + local_70;
  } while (local_18 < rest);
  *local_30 = local_74 + *local_30;
  GrisuRound(local_20,*local_28,local_18,rest,
             DigitGen::kPow10[local_74] << (-(char)local_40.e & 0x3fU),DVar3.f);
  return;
}

Assistant:

inline void DigitGen(const DiyFp& W, const DiyFp& Mp, uint64_t delta, char* buffer, int* len, int* K) {
    static const uint64_t kPow10[] = { 1ULL, 10ULL, 100ULL, 1000ULL, 10000ULL, 100000ULL, 1000000ULL, 10000000ULL, 100000000ULL,
                                       1000000000ULL, 10000000000ULL, 100000000000ULL, 1000000000000ULL,
                                       10000000000000ULL, 100000000000000ULL, 1000000000000000ULL,
                                       10000000000000000ULL, 100000000000000000ULL, 1000000000000000000ULL,
                                       10000000000000000000ULL };
    const DiyFp one(uint64_t(1) << -Mp.e, Mp.e);
    const DiyFp wp_w = Mp - W;
    uint32_t p1 = static_cast<uint32_t>(Mp.f >> -one.e);
    uint64_t p2 = Mp.f & (one.f - 1);
    int kappa = CountDecimalDigit32(p1); // kappa in [0, 9]
    *len = 0;

    while (kappa > 0) {
        uint32_t d = 0;
        switch (kappa) {
            case  9: d = p1 /  100000000; p1 %=  100000000; break;
            case  8: d = p1 /   10000000; p1 %=   10000000; break;
            case  7: d = p1 /    1000000; p1 %=    1000000; break;
            case  6: d = p1 /     100000; p1 %=     100000; break;
            case  5: d = p1 /      10000; p1 %=      10000; break;
            case  4: d = p1 /       1000; p1 %=       1000; break;
            case  3: d = p1 /        100; p1 %=        100; break;
            case  2: d = p1 /         10; p1 %=         10; break;
            case  1: d = p1;              p1 =           0; break;
            default:;
        }
        if (d || *len)
            buffer[(*len)++] = static_cast<char>('0' + static_cast<char>(d));
        kappa--;
        uint64_t tmp = (static_cast<uint64_t>(p1) << -one.e) + p2;
        if (tmp <= delta) {
            *K += kappa;
            GrisuRound(buffer, *len, delta, tmp, kPow10[kappa] << -one.e, wp_w.f);
            return;
        }
    }

    // kappa = 0
    for (;;) {
        p2 *= 10;
        delta *= 10;
        char d = static_cast<char>(p2 >> -one.e);
        if (d || *len)
            buffer[(*len)++] = static_cast<char>('0' + d);
        p2 &= one.f - 1;
        kappa--;
        if (p2 < delta) {
            *K += kappa;
            int index = -kappa;
            GrisuRound(buffer, *len, delta, p2, one.f, wp_w.f * (index < 20 ? kPow10[index] : 0));
            return;
        }
    }
}